

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O3

bool __thiscall
irr::io::CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase>::parseCDATA
          (CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase> *this)

{
  unsigned_short uVar1;
  unsigned_short *puVar2;
  uint uVar3;
  unsigned_short *puVar4;
  unsigned_short *puVar5;
  unsigned_short *c;
  unsigned_short uVar6;
  bool bVar7;
  string<unsigned_short> local_28;
  
  puVar2 = this->P;
  uVar1 = puVar2[1];
  if ((uVar1 == 0x5b) && (this->CurrentNodeType = EXN_CDATA, *puVar2 != 0)) {
    uVar3 = 0;
    c = puVar2;
    do {
      puVar4 = c;
      c = puVar4 + 1;
      this->P = c;
      uVar6 = *c;
      puVar2 = puVar2 + 1;
      if (uVar6 == 0) break;
      bVar7 = uVar3 < 7;
      uVar3 = uVar3 + 1;
    } while (bVar7);
    if (uVar6 != 0) {
      puVar4 = puVar4 + -1;
      do {
        if ((uVar6 == 0x3e) && (puVar4[1] == 0x5d)) {
          puVar5 = (unsigned_short *)0x0;
          if (*puVar4 == 0x5d) {
            puVar5 = puVar4;
          }
        }
        else {
          puVar5 = (unsigned_short *)0x0;
        }
        this->P = puVar4 + 3;
        uVar6 = puVar4[3];
      } while ((uVar6 != 0) && (puVar4 = puVar4 + 1, puVar5 == (unsigned_short *)0x0));
      if (puVar5 == (unsigned_short *)0x0) {
        core::string<unsigned_short>::operator=(&this->NodeName,"");
      }
      else {
        core::string<unsigned_short>::string<unsigned_short>
                  (&local_28,c,(s32)((ulong)((long)puVar5 - (long)puVar2) >> 1));
        core::string<unsigned_short>::operator=(&this->NodeName,&local_28);
        if (local_28.array != (unsigned_short *)0x0) {
          operator_delete__(local_28.array);
        }
      }
    }
  }
  return uVar1 == 0x5b;
}

Assistant:

bool parseCDATA()
	{
		if (*(P+1) != L'[')
			return false;

		CurrentNodeType = EXN_CDATA;

		// skip '<![CDATA['
		int count=0;
		while( *P && count<8 )
		{
			++P;
			++count;
		}

		if (!*P)
			return true;

		char_type *cDataBegin = P;
		char_type *cDataEnd = 0;

		// find end of CDATA
		while(*P && !cDataEnd)
		{
			if (*P == L'>' && 
			   (*(P-1) == L']') &&
			   (*(P-2) == L']'))
			{
				cDataEnd = P - 2;
			}

			++P;
		}

		if ( cDataEnd )
			NodeName = core::string<char_type>(cDataBegin, (int)(cDataEnd - cDataBegin));
		else
			NodeName = "";

		return true;
	}